

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdefines.cpp
# Opt level: O2

bool soplex::msginconsistent(char *name,char *file,int line)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,file);
  poVar1 = std::operator<<(poVar1,"(");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,line);
  poVar1 = std::operator<<(poVar1,") ");
  poVar1 = std::operator<<(poVar1,"Inconsistency detected in ");
  poVar1 = std::operator<<(poVar1,name);
  std::endl<char,std::char_traits<char>>(poVar1);
  return false;
}

Assistant:

bool msginconsistent(const char* name, const char* file, int line)
{
   assert(name != nullptr);
   assert(file != nullptr);
   assert(line >= 0);

   SPX_MSG_ERROR(std::cerr << file << "(" << line << ") "
                 << "Inconsistency detected in " << name << std::endl;)

   return 0;
}